

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void clip_image_f32_free(clip_image_f32 *img)

{
  void *in_RDI;
  
  if ((in_RDI != (void *)0x0) && (in_RDI != (void *)0x0)) {
    clip_image_f32::~clip_image_f32((clip_image_f32 *)0x16090b);
    operator_delete(in_RDI,0x20);
  }
  return;
}

Assistant:

void clip_image_f32_free(struct clip_image_f32 * img) { if (img) delete img; }